

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int parse_7zip_uint64(archive_read *a,uint64_t *val)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  
  pbVar2 = header_bytes(a,1);
  if (pbVar2 == (byte *)0x0) {
LAB_00689935:
    iVar6 = -1;
  }
  else {
    bVar1 = *pbVar2;
    *val = 0;
    iVar6 = 0;
    if ((char)bVar1 < '\0') {
      uVar5 = 0x80;
      lVar4 = 0;
      do {
        pbVar2 = header_bytes(a,1);
        if (pbVar2 == (byte *)0x0) goto LAB_00689935;
        uVar3 = (ulong)*pbVar2 << ((byte)lVar4 & 0x3f) | *val;
        *val = uVar3;
        lVar4 = lVar4 + 8;
        if (lVar4 == 0x40) {
          return 0;
        }
        uVar5 = uVar5 >> 1;
      } while ((uVar5 & bVar1) != 0);
      uVar5 = uVar5 + 0xff;
    }
    else {
      uVar5 = 0x17f;
      uVar3 = 0;
      lVar4 = 0;
    }
    *val = ((ulong)(uVar5 & bVar1) << ((byte)lVar4 & 0x3f)) + uVar3;
  }
  return iVar6;
}

Assistant:

static int
parse_7zip_uint64(struct archive_read *a, uint64_t *val)
{
	const unsigned char *p;
	unsigned char avail, mask;
	int i;

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	avail = *p;
	mask = 0x80;
	*val = 0;
	for (i = 0; i < 8; i++) {
		if (avail & mask) {
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			*val |= ((uint64_t)*p) << (8 * i);
			mask >>= 1;
			continue;
		}
		*val += ((uint64_t)(avail & (mask -1))) << (8 * i);
		break;
	}
	return (0);
}